

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O0

int __thiscall
Fl_Tree::extend_selection_dir
          (Fl_Tree *this,Fl_Tree_Item *from,Fl_Tree_Item *to,int dir,int val,bool visible)

{
  int iVar1;
  Fl_When FVar2;
  undefined4 in_register_0000000c;
  fd_set *__writefds;
  int iVar3;
  undefined4 in_register_00000084;
  undefined1 uVar4;
  undefined7 in_register_00000089;
  Fl_Tree_Item *local_38;
  Fl_Tree_Item *item;
  int changed;
  bool visible_local;
  int val_local;
  int dir_local;
  Fl_Tree_Item *to_local;
  Fl_Tree_Item *from_local;
  Fl_Tree *this_local;
  
  __writefds = (fd_set *)CONCAT44(in_register_0000000c,dir);
  item._0_4_ = 0;
  iVar3 = val;
  uVar4 = visible;
  local_38 = from;
  while( true ) {
    if (local_38 == (Fl_Tree_Item *)0x0) {
      return (int)item;
    }
    if (val == 0) {
      FVar2 = Fl_Widget::when((Fl_Widget *)this);
      iVar1 = deselect(this,local_38,FVar2);
      if (iVar1 != 0) {
        item._0_4_ = (int)item + 1;
      }
    }
    else if (val == 1) {
      FVar2 = Fl_Widget::when((Fl_Widget *)this);
      iVar1 = select(this,(int)local_38,(fd_set *)(ulong)FVar2,__writefds,
                     (fd_set *)CONCAT44(in_register_00000084,iVar3),
                     (timeval *)CONCAT71(in_register_00000089,uVar4));
      if (iVar1 != 0) {
        item._0_4_ = (int)item + 1;
      }
    }
    else if (val == 2) {
      FVar2 = Fl_Widget::when((Fl_Widget *)this);
      select_toggle(this,local_38,FVar2);
      item._0_4_ = (int)item + 1;
    }
    if (local_38 == to) break;
    __writefds = (fd_set *)(ulong)visible;
    local_38 = next_item(this,local_38,dir,visible);
  }
  return (int)item;
}

Assistant:

int Fl_Tree::extend_selection_dir(Fl_Tree_Item *from, Fl_Tree_Item *to,
			          int dir, int val, bool visible ) {
  int changed = 0;
  for (Fl_Tree_Item *item=from; item; item = next_item(item, dir, visible) ) {
    switch (val) {
      case 0:
	if ( deselect(item, when()) ) ++changed;
        break;
      case 1:
        if ( select(item, when()) ) ++changed;
	break;
      case 2:
        select_toggle(item, when());
	++changed;	// toggle always involves a change
	break;
    }
    if ( item==to ) break;
  }
  return(changed);
}